

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

EulerAngles *
AML::convertEulerAngleSequence
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,EulerSequence seq)

{
  undefined4 uVar1;
  EulerSequence EVar2;
  undefined1 local_60 [8];
  Matrix33 dcm;
  EulerSequence seq_local;
  EulerAngles *angles_local;
  
  dcm.field_0._68_4_ = seq;
  EVar2 = EulerAngles::getEulerSequence(angles);
  if (EVar2 == dcm.field_0._68_4_) {
    __return_storage_ptr__->phi = angles->phi;
    __return_storage_ptr__->theta = angles->theta;
    __return_storage_ptr__->psi = angles->psi;
    uVar1 = *(undefined4 *)&angles->field_0x1c;
    __return_storage_ptr__->seq_ = angles->seq_;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
  }
  else {
    EVar2 = EulerAngles::getEulerSequence(angles);
    if ((EVar2 == XYZ) && (dcm.field_0._68_4_ == 0)) {
      converEulerAnglesXYZtoZXZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    }
    else {
      EVar2 = EulerAngles::getEulerSequence(angles);
      if ((EVar2 == ZXZ) && (dcm.field_0._68_4_ == 6)) {
        converEulerAnglesZXZtoXYZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
      }
      else {
        eulerAngles2DCM((Matrix33 *)local_60,angles);
        dcm2EulerAngles(__return_storage_ptr__,(Matrix33 *)local_60,dcm.field_0._68_4_);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles convertEulerAngleSequence(const EulerAngles& angles, const EulerAngles::EulerSequence seq)
    {
        if (angles.getEulerSequence() == seq)
        {
            return angles;
        }
        else if (angles.getEulerSequence() == EulerAngles::EulerSequence::XYZ && seq == EulerAngles::EulerSequence::ZXZ)
        {
            return converEulerAnglesXYZtoZXZ(angles.phi, angles.theta, angles.psi);
        }
        else if (angles.getEulerSequence() == EulerAngles::EulerSequence::ZXZ && seq == EulerAngles::EulerSequence::XYZ)
        {
            return converEulerAnglesZXZtoXYZ(angles.phi, angles.theta, angles.psi);
        }
        else // General Case
        {
            Matrix33 dcm = eulerAngles2DCM(angles);
            return dcm2EulerAngles(dcm, seq);
        }
    }